

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

bool __thiscall
Opcode::AABBTreeCollider::Collide
          (AABBTreeCollider *this,AABBNoLeafTree *tree0,AABBNoLeafTree *tree1,Matrix4x4 *world0,
          Matrix4x4 *world1,Pair *cache)

{
  bool bVar1;
  Pair *cache_local;
  Matrix4x4 *world1_local;
  Matrix4x4 *world0_local;
  AABBNoLeafTree *tree1_local;
  AABBNoLeafTree *tree0_local;
  AABBTreeCollider *this_local;
  
  InitQuery(this,world0,world1);
  bVar1 = CheckTemporalCoherence(this,cache);
  if (((!bVar1) && (_Collide(this,tree0->mNodes,tree1->mNodes), cache != (Pair *)0x0)) &&
     (((this->super_Collider).mFlags & 4) != 0)) {
    cache->id0 = *(this->mPairs).mEntries;
    cache->id1 = (this->mPairs).mEntries[1];
  }
  return true;
}

Assistant:

bool AABBTreeCollider::Collide(const AABBNoLeafTree* tree0, const AABBNoLeafTree* tree1, const Matrix4x4* world0, const Matrix4x4* world1, Pair* cache)
{
	// Init collision query
	InitQuery(world0, world1);

	// Check previous state
	if(CheckTemporalCoherence(cache))		return true;

	// Perform collision query
	_Collide(tree0->GetNodes(), tree1->GetNodes());

	UPDATE_CACHE

	return true;
}